

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emmy_facade.cpp
# Opt level: O1

bool __thiscall
EmmyFacade::RegisterTypeName(EmmyFacade *this,lua_State *L,string *typeName,string *err)

{
  bool bVar1;
  shared_ptr<Debugger> debugger;
  Debugger *local_28;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_20;
  
  EmmyDebuggerManager::GetDebugger
            ((EmmyDebuggerManager *)&stack0xffffffffffffffd8,
             (lua_State *)&this->_emmyDebuggerManager);
  if (local_28 == (Debugger *)0x0) {
    bVar1 = false;
    std::__cxx11::string::_M_replace((ulong)err,0,(char *)err->_M_string_length,0x16337e);
  }
  else {
    bVar1 = Debugger::RegisterTypeName(local_28,typeName,err);
  }
  if (local_20._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_20._M_pi);
  }
  return bVar1;
}

Assistant:

bool EmmyFacade::RegisterTypeName(lua_State *L, const std::string &typeName, std::string &err) {
	auto debugger = GetDebugger(L);
	if (!debugger) {
		err = "Debugger does not exist";
		return false;
	}
	const auto suc = debugger->RegisterTypeName(typeName, err);
	return suc;
}